

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

FunctionPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPrototypeSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::NameSyntax&,slang::syntax::FunctionPortListSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,DataTypeSyntax *args_2,NameSyntax *args_3,
          FunctionPortListSyntax **args_4)

{
  Token keyword;
  Token lifetime;
  FunctionPrototypeSyntax *this_00;
  
  this_00 = (FunctionPrototypeSyntax *)allocate(this,0x48,8);
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  lifetime.kind = args_1->kind;
  lifetime._2_1_ = args_1->field_0x2;
  lifetime.numFlags.raw = (args_1->numFlags).raw;
  lifetime.rawLen = args_1->rawLen;
  lifetime.info = args_1->info;
  slang::syntax::FunctionPrototypeSyntax::FunctionPrototypeSyntax
            (this_00,keyword,lifetime,args_2,args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }